

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setY(QGraphicsItem *this,qreal y)

{
  QGraphicsItemPrivate *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if ((pQVar1->field_0x166 & 0x80) == 0) {
    cVar2 = qIsNaN(y);
    if (cVar2 == '\0') {
      local_28.xp = (pQVar1->pos).xp;
      local_28.yp = y;
      setPos(this,&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setY(qreal y)
{
    if (d_ptr->inDestructor)
        return;

    if (qIsNaN(y))
        return;

    setPos(QPointF(d_ptr->pos.x(), y));
}